

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O2

OrderType duckdb::GetOrder<duckdb::OrderType>(ClientContext *context,Expression *expr)

{
  OrderType OVar1;
  int iVar2;
  InvalidInputException *this;
  string order_name;
  string local_80;
  Value order_value;
  
  iVar2 = (*(expr->super_BaseExpression)._vptr_BaseExpression[0xf])(expr);
  if ((char)iVar2 != '\0') {
    ExpressionExecutor::EvaluateScalar(&order_value,context,expr,false);
    Value::ToString_abi_cxx11_(&local_80,&order_value);
    StringUtil::Upper(&order_name,&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    OVar1 = EnumUtil::FromString<duckdb::OrderType>(order_name._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)&order_name);
    Value::~Value(&order_value);
    return OVar1;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&order_value,"Sorting order must be a constant",(allocator *)&order_name);
  InvalidInputException::InvalidInputException(this,(string *)&order_value);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static T GetOrder(ClientContext &context, Expression &expr) {
	if (!expr.IsFoldable()) {
		throw InvalidInputException("Sorting order must be a constant");
	}
	Value order_value = ExpressionExecutor::EvaluateScalar(context, expr);
	auto order_name = StringUtil::Upper(order_value.ToString());
	return EnumUtil::FromString<T>(order_name.c_str());
}